

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Config_testZeroSamplingParam_Test::TestBody(Config_testZeroSamplingParam_Test *this)

{
  bool bVar1;
  Config *this_00;
  char *pcVar2;
  AssertHelper local_218 [8];
  Message local_210 [8];
  double local_208;
  undefined4 local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  Node local_1d8;
  undefined1 local_1b8 [8];
  Config config;
  char *kConfigYAML;
  Config_testZeroSamplingParam_Test *this_local;
  
  config._baggageRestrictions._refreshInterval.__r = (rep)anon_var_dwarf_ca87;
  YAML::Load(&local_1d8.m_isValid);
  Config::parse((Config *)local_1b8,&local_1d8);
  YAML::Node::~Node(&local_1d8);
  local_1fc = 0;
  this_00 = Config::sampler((Config *)local_1b8);
  local_208 = samplers::Config::param(this_00);
  testing::internal::EqHelper<true>::Compare<int,double>
            (local_1f8,"0",(int *)"config.sampler().param()",(double *)&local_1fc,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(local_218);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  Config::~Config((Config *)local_1b8);
  return;
}

Assistant:

TEST(Config, testZeroSamplingParam)
{
    {
        constexpr auto kConfigYAML = R"cfg(
sampler:
    param: 0
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ(0, config.sampler().param());
    }
}